

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O0

QTextDocumentFragment QTextDocumentFragment::fromPlainText(QString *plainText)

{
  long lVar1;
  QString *text;
  QTextCursor *in_RSI;
  QTextDocumentFragmentPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentFragment *res;
  QTextCursor cursor;
  QTextDocumentFragmentPrivate *document;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  byte bVar3;
  QTextDocumentFragmentPrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  document = in_RDI;
  this = in_RDI;
  QTextDocumentFragment((QTextDocumentFragment *)in_RDI);
  text = (QString *)operator_new(0x18);
  QTextCursor::QTextCursor((QTextCursor *)0x7e9379);
  QTextDocumentFragmentPrivate::QTextDocumentFragmentPrivate(this,in_RSI);
  *(QString **)document = text;
  QTextCursor::~QTextCursor((QTextCursor *)0x7e939f);
  *(byte *)(*(long *)document + 0x10) = *(byte *)(*(long *)document + 0x10) & 0xfe | 1;
  QTextCursor::QTextCursor
            ((QTextCursor *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),(QTextDocument *)document);
  QTextCursor::insertText((QTextCursor *)document,text);
  bVar3 = 1;
  QTextCursor::~QTextCursor((QTextCursor *)0x7e93ee);
  if ((bVar3 & 1) == 0) {
    ~QTextDocumentFragment((QTextDocumentFragment *)text);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QTextDocumentFragment)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentFragment QTextDocumentFragment::fromPlainText(const QString &plainText)
{
    QTextDocumentFragment res;

    res.d = new QTextDocumentFragmentPrivate;
    res.d->importedFromPlainText = true;
    QTextCursor cursor(res.d->doc);
    cursor.insertText(plainText);
    return res;
}